

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::rk(Graph *this,char *word,char *text,int q)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  
  sVar1 = strlen(word);
  sVar2 = strlen(text);
  iVar12 = (int)sVar2;
  uVar11 = (uint)sVar1;
  if ((int)uVar11 <= iVar12) {
    lVar4 = 1;
    uVar7 = (ulong)q;
    if (1 < (int)uVar11) {
      iVar9 = uVar11 - 1;
      do {
        lVar4 = (lVar4 * 0x1a) % (long)uVar7;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    if ((int)uVar11 < 1) {
      lVar5 = 0;
      lVar6 = 0;
    }
    else {
      uVar10 = 0;
      lVar6 = 0;
      lVar5 = 0;
      do {
        lVar5 = ((long)word[uVar10] + lVar5 * 0x1a) % (long)uVar7;
        lVar6 = ((long)text[uVar10] + lVar6 * 0x1a) % (long)uVar7;
        uVar10 = uVar10 + 1;
      } while ((uVar11 & 0x7fffffff) != uVar10);
    }
    if (-1 < (int)(iVar12 - uVar11)) {
      uVar10 = 0;
      pcVar8 = text;
      do {
        if (lVar5 == lVar6) {
          uVar3 = 0;
          if ((int)uVar11 < 1) {
LAB_001027eb:
            if ((uint)uVar3 != uVar11) goto LAB_00102820;
          }
          else {
            do {
              if (pcVar8[uVar3] != word[uVar3]) goto LAB_001027eb;
              uVar3 = uVar3 + 1;
            } while ((uVar11 & 0x7fffffff) != uVar3);
          }
          addEdge(this,(int)uVar10,(int)uVar10 + uVar11);
        }
LAB_00102820:
        if (uVar10 < iVar12 - uVar11) {
          lVar6 = ((long)text[uVar10 + (long)(int)uVar11] + (lVar6 - text[uVar10] * lVar4) * 0x1a) %
                  (long)uVar7;
          lVar6 = (lVar6 >> 0x3f & uVar7) + lVar6;
        }
        uVar10 = uVar10 + 1;
        pcVar8 = pcVar8 + 1;
      } while (uVar10 != (iVar12 - uVar11) + 1);
    }
  }
  return;
}

Assistant:

void Graph::rk(const char *word, const char *text, int q) {
    int wordLength = strlen(word);
    int textLength = strlen(text);
    int i,j;
    long long wordHash = 0;
    long long textHash = 0;
    long long h = 1;
    if(wordLength>textLength){
        return;
    }
    for ( i = 0; i < wordLength-1; i++) {
        h = (h * alphabet) % q;
    }
    for ( i = 0; i < wordLength; i++) {
        wordHash = (alphabet*wordHash + word[i])%q;
        textHash = (alphabet*textHash + text[i])%q;
    }
    for ( i = 0; i <= textLength - wordLength; i++) {
        if ( wordHash == textHash ) {
            for ( j = 0; j < wordLength; j++) {
                if (text[i+j] != word[j]) {
                    break;
                }
            }
            if (j == wordLength) {
                addEdge(i, i + wordLength);
            }
        }
        if ( i < textLength-wordLength ) {
            textHash = (alphabet*(textHash - text[i]*h) + text[i+wordLength])%q;
            if (textHash < 0)
                textHash = (textHash + q);
        }
    }
}